

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O1

void printParticleCost(Particle *particle,int iterator)

{
  char *__filename;
  FILE *__stream;
  ostream *poVar1;
  double **ppdVar2;
  ulong uVar3;
  
  __filename = catStrStr(answerAddress,"cost.txt");
  __stream = fopen(__filename,"a");
  if (__stream == (FILE *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Can\'t print rep answer");
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(-1);
  }
  fprintf(__stream,"iterator=%d\n",iterator);
  ppdVar2 = &particle->Cost;
  uVar3 = 0;
  do {
    fprintf(__stream,"i=%d cost0 =%10.3f\n",**ppdVar2,uVar3 & 0xffffffff);
    uVar3 = uVar3 + 1;
    ppdVar2 = ppdVar2 + 0xf;
  } while (uVar3 != 5);
  fclose(__stream);
  return;
}

Assistant:

void printParticleCost(Particle * particle, int iterator){
    char *costFile = catStrStr(answerAddress, "cost.txt");
    FILE *outFile;
    outFile = fopen(costFile, "a");
    if (outFile == NULL) {
        cout << "Can't print rep answer" << endl;
        exit(-1);
    }
    fprintf(outFile, "iterator=%d\n", iterator);
    for (int i=0; i<nPop; i++){
        /*fprintf(outFile, "i=%d cost0 =%10.3f cost1 =%10.3f\n",
                i, particle[i].Cost[0], particle[i].Cost[1]);*/
        fprintf(outFile, "i=%d cost0 =%10.3f\n",
                i, particle[i].Cost[0]);
    }
    fclose(outFile);
}